

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteCompileRule
          (cmNinjaTargetGenerator *this,string *lang,string *config,WithScanning withScanning)

{
  size_type *psVar1;
  pointer *ppbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer *ppbVar5;
  cmMakefile *pcVar6;
  pointer pcVar7;
  cmLocalNinjaGenerator *pcVar8;
  cmGeneratorTarget *pcVar9;
  cmMakefile *pcVar10;
  long *plVar11;
  string_view lang_00;
  string_view lang_01;
  string_view srcFile;
  string_view srcFile_00;
  string_view ddiFile;
  string_view ddiFile_00;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile_00;
  pointer pbVar12;
  bool bVar13;
  bool bVar14;
  TargetType targetType;
  int iVar15;
  string *psVar16;
  cmGlobalNinjaGenerator *pcVar17;
  string *psVar18;
  cmValue cVar19;
  cmValue cVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar21;
  undefined8 uVar22;
  cmNinjaTargetGenerator *this_00;
  _Alloc_hider _Var23;
  pointer pbVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  long lVar26;
  bool bVar27;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_20;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_22;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_23;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_24;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_25;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_26;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_27;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_28;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_29;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_30;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_31;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_32;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_33;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_34;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_35;
  string_view source;
  string_view source_00;
  string_view cmakeCmd_00;
  string_view cmakeCmd_01;
  string_view tdi_00;
  string_view tdi_01;
  undefined8 in_stack_fffffffffffff918;
  cmList scanCommands;
  string cudaCompileMode;
  string cmdVar;
  cmRulePlaceholderExpander *local_620;
  cmList compileCmds;
  string cldeps;
  string responseFlagVar;
  string responseFlag;
  string flags;
  string local_488;
  string launcher;
  cmNinjaRule rule;
  string cmakeCmd;
  string tdi;
  string modmapFormat;
  string local_2b0;
  string local_290;
  string local_270;
  string val;
  undefined7 uStack_21f;
  string modmapFormatVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string local_1c0;
  char *local_1a0;
  undefined8 uStack_198;
  undefined1 local_190;
  uint7 uStack_18f;
  RuleVariables local_188;
  
  memset(&local_188.TargetVersionMajor,0,0x138);
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_188.CMTargetName = (psVar16->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  this_00 = (cmNinjaTargetGenerator *)(ulong)targetType;
  psVar16 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  local_188.CMTargetType = (psVar16->_M_dataplus)._M_p;
  local_188.Language = (lang->_M_dataplus)._M_p;
  local_188.Source = "$in";
  local_188.Object = "$out";
  local_188.Defines = "$DEFINES";
  local_188.Includes = "$INCLUDES";
  local_188.TargetPDB = "$TARGET_PDB";
  local_188.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_188.ObjectDir = "$OBJECT_DIR";
  local_188.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_188.CudaCompileMode = "$CUDA_COMPILE_MODE";
  local_188.ISPCHeader = "$ISPC_HEADER_FILE";
  pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
  bVar13 = NeedExplicitPreprocessing(this_00,lang);
  flags._M_dataplus._M_p = (pointer)&flags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"$FLAGS","");
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  iVar15 = std::__cxx11::string::compare((char *)lang);
  if ((iVar15 != 0) && (bVar14 = ForceResponseFile(this), bVar14)) {
    rule.Name._M_dataplus._M_p = (pointer)0x6;
    rule.Name._M_string_length = (long)"The CMAKE_" + 4;
    rule.Name.field_2._M_allocated_capacity = 0;
    rule.Command._M_dataplus._M_p = (lang->_M_dataplus)._M_p;
    rule.Name.field_2._8_8_ = lang->_M_string_length;
    rule.Command._M_string_length = 0;
    rule.Command.field_2._M_allocated_capacity = 0x13;
    rule.Command.field_2._8_8_ = anon_var_dwarf_1a7f2c6;
    rule.Description._M_dataplus._M_p = (pointer)0x0;
    views._M_len = 3;
    views._M_array = (iterator)&rule;
    cmCatViews(&responseFlagVar,views);
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&responseFlagVar);
    std::__cxx11::string::_M_assign((string *)&responseFlag);
    if ((responseFlag._M_string_length == 0) &&
       (iVar15 = std::__cxx11::string::compare((char *)lang), iVar15 != 0)) {
      std::__cxx11::string::_M_replace
                ((ulong)&responseFlag,0,(char *)responseFlag._M_string_length,0x88c3f5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlagVar._M_dataplus._M_p != &responseFlagVar.field_2) {
      operator_delete(responseFlagVar._M_dataplus._M_p,
                      responseFlagVar.field_2._M_allocated_capacity + 1);
    }
  }
  rule.Name._M_dataplus._M_p = (pointer)0x6;
  rule.Name._M_string_length = (long)"The CMAKE_" + 4;
  rule.Name.field_2._M_allocated_capacity = 0;
  rule.Command._M_dataplus._M_p = (lang->_M_dataplus)._M_p;
  rule.Name.field_2._8_8_ = lang->_M_string_length;
  rule.Command._M_string_length = 0;
  rule.Command.field_2._M_allocated_capacity = 0x12;
  rule.Command.field_2._8_8_ = anon_var_dwarf_1a7f2ea;
  rule.Description._M_dataplus._M_p = (pointer)0x0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&rule;
  cmCatViews(&modmapFormatVar,views_00);
  psVar16 = cmMakefile::GetSafeDefinition
                      ((this->super_cmCommonTargetGenerator).Makefile,&modmapFormatVar);
  modmapFormat._M_dataplus._M_p = (pointer)&modmapFormat.field_2;
  pcVar7 = (psVar16->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&modmapFormat,pcVar7,pcVar7 + psVar16->_M_string_length);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_620);
  pcVar8 = this->LocalGenerator;
  GetTargetDependInfoPath(&rule.Name,this,lang,config);
  pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar16 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,&rule.Name);
  source._M_str = (psVar16->_M_dataplus)._M_p;
  source._M_len = psVar16->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&tdi,(cmOutputConverter *)pcVar8,source,SHELL,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
    operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
  }
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar9 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar8 = this->LocalGenerator;
  rule.Name._M_dataplus._M_p = (pointer)&rule.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"RULE_LAUNCH_COMPILE","");
  cmLocalGenerator::GetRuleLauncher(&val,(cmLocalGenerator *)pcVar8,pcVar9,&rule.Name,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
    operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
  }
  if (val._M_string_length != 0) {
    responseFlagVar._M_dataplus._M_p = (pointer)val._M_string_length;
    responseFlagVar._M_string_length = (size_type)val._M_dataplus._M_p;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    rule.Name.field_2._M_allocated_capacity = (long)&rule.Name.field_2 + 8;
    rule.Name._M_dataplus._M_p = (pointer)0x0;
    rule.Name._M_string_length = 1;
    rule.Name.field_2._M_local_buf[8] = 0x20;
    responseFlagVar.field_2._8_8_ = 1;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_01);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&cudaCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar8 = this->LocalGenerator;
  psVar16 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  source_00._M_str = (psVar16->_M_dataplus)._M_p;
  source_00._M_len = psVar16->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&cmakeCmd,(cmOutputConverter *)pcVar8,source_00,SHELL,false);
  if (withScanning == Yes) {
    pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
    rule.Name._M_dataplus._M_p = (pointer)0x6;
    rule.Name._M_string_length = (long)"The CMAKE_" + 4;
    rule.Name.field_2._M_allocated_capacity = 0;
    rule.Command._M_dataplus._M_p = (lang->_M_dataplus)._M_p;
    rule.Name.field_2._8_8_ = lang->_M_string_length;
    rule.Command._M_string_length = 0;
    rule.Command.field_2._M_allocated_capacity = 0x17;
    rule.Command.field_2._8_8_ = anon_var_dwarf_1a7f302;
    rule.Description._M_dataplus._M_p = (pointer)0x0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)&rule;
    cmCatViews(&responseFlagVar,views_02);
    psVar16 = cmMakefile::GetSafeDefinition(pcVar10,&responseFlagVar);
    paVar3 = &responseFlagVar.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlagVar._M_dataplus._M_p != paVar3) {
      operator_delete(responseFlagVar._M_dataplus._M_p,
                      responseFlagVar.field_2._M_allocated_capacity + 1);
    }
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
    cudaCompileMode._M_string_length = 0;
    cudaCompileMode.field_2._M_allocated_capacity =
         cudaCompileMode.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cmdVar._M_dataplus._M_p = (pointer)&cmdVar.field_2;
    cmdVar._M_string_length = 0;
    cmdVar.field_2._M_allocated_capacity = cmdVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    if (bVar13) {
      LanguagePreprocessAndScanRule(&rule.Name,this,lang,config);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
        operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&cmdVar,0,(char *)cmdVar._M_string_length,0x8bc65d);
      rule.Name._M_dataplus._M_p = (pointer)0x6;
      rule.Name._M_string_length = (long)"The CMAKE_" + 4;
      rule.Name.field_2._M_allocated_capacity = 0;
      rule.Command._M_dataplus._M_p = (lang->_M_dataplus)._M_p;
      rule.Name.field_2._8_8_ = lang->_M_string_length;
      rule.Command._M_string_length = 0;
      rule.Command.field_2._M_allocated_capacity = 0x12;
      rule.Command.field_2._8_8_ = anon_var_dwarf_1a7f326;
      rule.Description._M_dataplus._M_p = (pointer)0x0;
      views_03._M_len = 3;
      views_03._M_array = (iterator)&rule;
      cmCatViews(&responseFlagVar,views_03);
      psVar18 = cmMakefile::GetRequiredDefinition(pcVar6,&responseFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(responseFlagVar._M_dataplus._M_p,
                        responseFlagVar.field_2._M_allocated_capacity + 1);
      }
      pbVar21 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar12 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar25 = &(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar11 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar25 + -1))->_M_dataplus)._M_p;
          if (paVar25 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11) {
            operator_delete(plVar11,paVar25->_M_allocated_capacity + 1);
          }
          pbVar24 = (pointer)(paVar25 + 1);
          paVar25 = paVar25 + 2;
        } while (pbVar24 != pbVar21);
        scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
      }
      cmList::Insert(&scanCommands.Values,
                     (const_iterator)
                     scanCommands.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,psVar18,Yes,No);
      pbVar12 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar21 = scanCommands.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          rule.Name._M_dataplus._M_p = (pointer)launcher._M_string_length;
          rule.Name._M_string_length = (size_type)launcher._M_dataplus._M_p;
          rule.Name.field_2._M_allocated_capacity = 0;
          rule.Command._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          rule.Name.field_2._8_8_ = pbVar21->_M_string_length;
          rule.Command._M_string_length = 0;
          views_05._M_len = 2;
          views_05._M_array = (iterator)&rule;
          cmCatViews(&responseFlagVar,views_05);
          std::__cxx11::string::operator=((string *)pbVar21,(string *)&responseFlagVar);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)responseFlagVar._M_dataplus._M_p != paVar3) {
            operator_delete(responseFlagVar._M_dataplus._M_p,
                            responseFlagVar.field_2._M_allocated_capacity + 1);
          }
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != pbVar12);
      }
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._9_7_ = uStack_21f;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._8_1_ = 1;
      lang_00._M_str = (char *)0x4;
      lang_00._M_len = (size_t)(lang->_M_dataplus)._M_p;
      srcFile._M_str = &DAT_00000019;
      srcFile._M_len = (size_t)"$out";
      ddiFile._M_str = (char *)0x3;
      ddiFile._M_len = (size_t)"$DYNDEP_INTERMEDIATE_FILE";
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = (size_t)"$in";
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           in_stack_fffffffffffff918;
      cmakeCmd_00._M_str = (char *)tdi._M_string_length;
      cmakeCmd_00._M_len = (size_t)cmakeCmd._M_dataplus._M_p;
      tdi_00._M_str = (char *)lang->_M_string_length;
      tdi_00._M_len = (size_t)tdi._M_dataplus._M_p;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&rule.Name,(_anonymous_namespace_ *)cmakeCmd._M_string_length,cmakeCmd_00,tdi_00,
                 lang_00,srcFile,ddiFile,srcOrigFile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&scanCommands,
                 &rule.Name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
        operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      LanguageScanRule(&rule.Name,this,lang,config);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
        operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&cmdVar,0,(char *)cmdVar._M_string_length,0x8bbb53);
      rule.Name._M_dataplus._M_p = (pointer)0x6;
      rule.Name._M_string_length = (long)"The CMAKE_" + 4;
      rule.Name.field_2._M_allocated_capacity = 0;
      rule.Command._M_dataplus._M_p = (lang->_M_dataplus)._M_p;
      rule.Name.field_2._8_8_ = lang->_M_string_length;
      rule.Command._M_string_length = 0;
      rule.Command.field_2._M_allocated_capacity = 0xf;
      rule.Command.field_2._8_8_ = (long)"CMAKE_CXX_SCANDEP_SOURCE" + 9;
      rule.Description._M_dataplus._M_p = (pointer)0x0;
      views_04._M_len = 3;
      views_04._M_array = (iterator)&rule;
      cmCatViews(&responseFlagVar,views_04);
      psVar18 = cmMakefile::GetRequiredDefinition(pcVar6,&responseFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(responseFlagVar._M_dataplus._M_p,
                        responseFlagVar.field_2._M_allocated_capacity + 1);
      }
      pbVar21 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar12 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar25 = &(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar11 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar25 + -1))->_M_dataplus)._M_p;
          if (paVar25 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11) {
            operator_delete(plVar11,paVar25->_M_allocated_capacity + 1);
          }
          pbVar24 = (pointer)(paVar25 + 1);
          paVar25 = paVar25 + 2;
        } while (pbVar24 != pbVar21);
        scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
      }
      cmList::Insert(&scanCommands.Values,
                     (const_iterator)
                     scanCommands.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,psVar18,Yes,No);
      pbVar12 = scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar21 = scanCommands.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          rule.Name._M_dataplus._M_p = (pointer)launcher._M_string_length;
          rule.Name._M_string_length = (size_type)launcher._M_dataplus._M_p;
          rule.Name.field_2._M_allocated_capacity = 0;
          rule.Command._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          rule.Name.field_2._8_8_ = pbVar21->_M_string_length;
          rule.Command._M_string_length = 0;
          views_06._M_len = 2;
          views_06._M_array = (iterator)&rule;
          cmCatViews(&responseFlagVar,views_06);
          std::__cxx11::string::operator=((string *)pbVar21,(string *)&responseFlagVar);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)responseFlagVar._M_dataplus._M_p != paVar3) {
            operator_delete(responseFlagVar._M_dataplus._M_p,
                            responseFlagVar.field_2._M_allocated_capacity + 1);
          }
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != pbVar12);
      }
    }
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         scanCommands.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         scanCommands.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         scanCommands.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown.dwarf_1ac2362::GetScanRule
              (&rule,(anon_unknown_dwarf_1ac2362 *)cudaCompileMode._M_dataplus._M_p,
               (string *)cudaCompileMode._M_string_length,&cmdVar,psVar16,&local_188,&responseFlag,
               &flags,local_620,this->LocalGenerator,&local_1d8,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    responseFlagVar._M_dataplus._M_p = &DAT_00000014;
    responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f33e;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    views_07._M_len = 3;
    views_07._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cldeps,views_07);
    std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&cldeps);
    paVar25 = &cldeps.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != paVar25) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    if (bVar13) {
      responseFlagVar._M_dataplus._M_p = &DAT_00000009;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f36e;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = lang->_M_string_length;
      views_08._M_len = 3;
      views_08._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cldeps,views_08);
    }
    else {
      responseFlagVar._M_dataplus._M_p = &DAT_00000011;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f356;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = lang->_M_string_length;
      views_09._M_len = 3;
      views_09._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cldeps,views_09);
    }
    std::__cxx11::string::operator=((string *)&rule.Description,(string *)&cldeps);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != paVar25) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar17,&rule);
    cmNinjaRule::~cmNinjaRule(&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
      operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&scanCommands.Values);
    if (bVar13) {
      bVar14 = CompileWithDefines(this,lang);
      if (!bVar14) {
        local_188.Defines = "";
      }
      LanguageScanRule(&cudaCompileMode,this,lang,config);
      cldeps._M_dataplus._M_p = (pointer)0x0;
      cldeps._M_string_length = 0;
      cldeps.field_2._M_allocated_capacity = 0;
      local_190 = 0;
      lang_01._M_str = (char *)0x3;
      lang_01._M_len = (size_t)(lang->_M_dataplus)._M_p;
      srcFile_00._M_str = (char *)0x4;
      srcFile_00._M_len = (size_t)"$in";
      ddiFile_00._M_str = local_1a0;
      ddiFile_00._M_len = (size_t)"$out";
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = (char *)((ulong)uStack_18f << 8);
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = uStack_198;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           in_stack_fffffffffffff918;
      cmakeCmd_01._M_str = (char *)tdi._M_string_length;
      cmakeCmd_01._M_len = (size_t)cmakeCmd._M_dataplus._M_p;
      tdi_01._M_str = (char *)lang->_M_string_length;
      tdi_01._M_len = (size_t)tdi._M_dataplus._M_p;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&rule.Name,(_anonymous_namespace_ *)cmakeCmd._M_string_length,cmakeCmd_01,tdi_01,
                 lang_01,srcFile_00,ddiFile_00,srcOrigFile_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cldeps,
                 &rule.Name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rule.Name._M_dataplus._M_p != &rule.Name.field_2) {
        operator_delete(rule.Name._M_dataplus._M_p,rule.Name.field_2._M_allocated_capacity + 1);
      }
      responseFlagVar._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&responseFlagVar,"");
      paVar4 = &cmdVar.field_2;
      cmdVar._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cmdVar,"");
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)cldeps._M_dataplus._M_p;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)cldeps._M_string_length;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cldeps.field_2._M_allocated_capacity;
      cldeps._M_dataplus._M_p = (pointer)0x0;
      cldeps._M_string_length = 0;
      cldeps.field_2._M_allocated_capacity = 0;
      anon_unknown.dwarf_1ac2362::GetScanRule
                (&rule,(anon_unknown_dwarf_1ac2362 *)cudaCompileMode._M_dataplus._M_p,
                 (string *)cudaCompileMode._M_string_length,&responseFlagVar,psVar16,&local_188,
                 &cmdVar,&flags,local_620,this->LocalGenerator,&local_1f8,config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != paVar4) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(responseFlagVar._M_dataplus._M_p,
                        responseFlagVar.field_2._M_allocated_capacity + 1);
      }
      responseFlagVar._M_dataplus._M_p = &DAT_00000014;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f33e;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = lang->_M_string_length;
      views_10._M_len = 3;
      views_10._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cmdVar,views_10);
      std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&cmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != paVar4) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
      responseFlagVar._M_dataplus._M_p = (pointer)0xb;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_ac1aa4;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = lang->_M_string_length;
      views_11._M_len = 3;
      views_11._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cmdVar,views_11);
      std::__cxx11::string::operator=((string *)&rule.Description,(string *)&cmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != paVar4) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
      pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar17,&rule);
      cmNinjaRule::~cmNinjaRule(&rule);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cldeps);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
        operator_delete(cudaCompileMode._M_dataplus._M_p,
                        cudaCompileMode.field_2._M_allocated_capacity + 1);
      }
    }
    LanguageDyndepRule(&local_270,this,lang,config);
    rule.Name._M_dataplus._M_p = (pointer)&rule.Name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == &local_270.field_2) {
      rule.Name.field_2._8_8_ = local_270.field_2._8_8_;
    }
    else {
      rule.Name._M_dataplus._M_p = local_270._M_dataplus._M_p;
    }
    rule.Name.field_2._M_allocated_capacity._1_7_ = local_270.field_2._M_allocated_capacity._1_7_;
    rule.Name.field_2._M_local_buf[0] = local_270.field_2._M_local_buf[0];
    rule.Command._M_dataplus._M_p = (pointer)&rule.Command.field_2;
    rule.Name._M_string_length = local_270._M_string_length;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    rule.Command._M_string_length = 0;
    rule.Command.field_2._M_allocated_capacity =
         rule.Command.field_2._M_allocated_capacity & 0xffffffffffffff00;
    rule.Description._M_dataplus._M_p = (pointer)&rule.Description.field_2;
    rule.Description._M_string_length = 0;
    rule.Description.field_2._M_local_buf[0] = '\0';
    rule.Comment._M_dataplus._M_p = (pointer)&rule.Comment.field_2;
    rule.Comment._M_string_length = 0;
    rule.Comment.field_2._M_local_buf[0] = '\0';
    rule.DepFile._M_dataplus._M_p = (pointer)&rule.DepFile.field_2;
    rule.DepFile._M_string_length = 0;
    rule.DepFile.field_2._M_local_buf[0] = '\0';
    rule.DepType._M_dataplus._M_p = (pointer)&rule.DepType.field_2;
    rule.DepType._M_string_length = 0;
    rule.DepType.field_2._M_local_buf[0] = '\0';
    rule.RspFile._M_dataplus._M_p = (pointer)&rule.RspFile.field_2;
    rule.RspFile._M_string_length = 0;
    rule.RspFile.field_2._M_local_buf[0] = '\0';
    rule.RspContent._M_dataplus._M_p = (pointer)&rule.RspContent.field_2;
    rule.RspContent._M_string_length = 0;
    rule.RspContent.field_2._M_local_buf[0] = '\0';
    rule.Restat._M_dataplus._M_p = (pointer)&rule.Restat.field_2;
    rule.Restat._M_string_length = 0;
    rule.Restat.field_2._M_local_buf[0] = '\0';
    rule.Generator = false;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_replace((ulong)&rule.RspFile,0,(char *)0x0,0x8bbc1d);
    std::__cxx11::string::_M_replace
              ((ulong)&rule.RspContent,0,(char *)rule.RspContent._M_string_length,0x8bbc19);
    std::__cxx11::string::_M_replace
              ((ulong)&rule.Restat,0,(char *)rule.Restat._M_string_length,0x9165f8);
    cmdVar._M_dataplus._M_p = (pointer)&cmdVar.field_2;
    cmdVar._M_string_length = 0;
    cmdVar.field_2._M_allocated_capacity = cmdVar.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    if (modmapFormat._M_string_length != 0) {
      responseFlagVar._M_dataplus._M_p = (pointer)0xd;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f3ea;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = modmapFormat._M_string_length;
      views_12._M_len = 2;
      views_12._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cudaCompileMode,views_12);
      std::__cxx11::string::_M_append((char *)&cmdVar,(ulong)cudaCompileMode._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
        operator_delete(cudaCompileMode._M_dataplus._M_p,
                        cudaCompileMode.field_2._M_allocated_capacity + 1);
      }
    }
    cldeps._M_dataplus._M_p = (pointer)0x0;
    cldeps._M_string_length = 0;
    cldeps.field_2._M_allocated_capacity = 0;
    responseFlagVar._M_dataplus._M_p = (pointer)cmakeCmd._M_string_length;
    responseFlagVar._M_string_length = (size_type)cmakeCmd._M_dataplus._M_p;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = 0x1d;
    views_13._M_len = 8;
    views_13._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_13);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cldeps,
               &cudaCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
    cudaCompileMode._M_string_length = 0;
    cudaCompileMode.field_2._M_allocated_capacity =
         cudaCompileMode.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cmLocalNinjaGenerator::BuildCommandLine
              (&responseFlagVar,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cldeps,config,config,&cudaCompileMode,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&responseFlagVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlagVar._M_dataplus._M_p != paVar3) {
      operator_delete(responseFlagVar._M_dataplus._M_p,
                      responseFlagVar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cldeps);
    responseFlagVar._M_dataplus._M_p = &DAT_00000028;
    responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f436;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    cudaCompileMode.field_2._M_allocated_capacity = (long)&cudaCompileMode.field_2 + 8;
    cudaCompileMode._M_dataplus._M_p = (pointer)0x0;
    cudaCompileMode._M_string_length = 1;
    cudaCompileMode.field_2._M_local_buf[8] = 0x2e;
    views_14._M_len = 3;
    views_14._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cldeps,views_14);
    std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&cldeps);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != paVar25) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    responseFlagVar._M_dataplus._M_p = (pointer)0xb;
    responseFlagVar._M_string_length = (size_type)anon_var_dwarf_ac1aa4;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    views_15._M_len = 3;
    views_15._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_15);
    std::__cxx11::string::operator=((string *)&rule.Description,(string *)&cudaCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar17,&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
      operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  LanguageCompilerRule(&local_290,this,lang,config,withScanning);
  rule.Name._M_dataplus._M_p = (pointer)&rule.Name.field_2;
  paVar3 = &local_290.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar3) {
    rule.Name.field_2._8_8_ = local_290.field_2._8_8_;
  }
  else {
    rule.Name._M_dataplus._M_p = local_290._M_dataplus._M_p;
  }
  rule.Command._M_dataplus._M_p = (pointer)&rule.Command.field_2;
  rule.Name._M_string_length = local_290._M_string_length;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  rule.Command._M_string_length = 0;
  rule.Command.field_2._M_allocated_capacity =
       rule.Command.field_2._M_allocated_capacity & 0xffffffffffffff00;
  rule.Description._M_dataplus._M_p = (pointer)&rule.Description.field_2;
  rule.Description._M_string_length = 0;
  rule.Description.field_2._M_local_buf[0] = '\0';
  rule.Comment._M_dataplus._M_p = (pointer)&rule.Comment.field_2;
  rule.Comment._M_string_length = 0;
  rule.Comment.field_2._M_local_buf[0] = '\0';
  rule.DepFile._M_dataplus._M_p = (pointer)&rule.DepFile.field_2;
  rule.DepFile._M_string_length = 0;
  rule.DepFile.field_2._M_local_buf[0] = '\0';
  rule.DepType._M_dataplus._M_p = (pointer)&rule.DepType.field_2;
  rule.DepType._M_string_length = 0;
  rule.DepType.field_2._M_local_buf[0] = '\0';
  rule.RspFile._M_dataplus._M_p = (pointer)&rule.RspFile.field_2;
  rule.RspFile._M_string_length = 0;
  rule.RspFile.field_2._M_local_buf[0] = '\0';
  rule.RspContent._M_dataplus._M_p = (pointer)&rule.RspContent.field_2;
  rule.RspContent._M_string_length = 0;
  rule.RspContent.field_2._M_local_buf[0] = '\0';
  rule.Restat._M_dataplus._M_p = (pointer)&rule.Restat.field_2;
  rule.Restat._M_string_length = 0;
  rule.Restat.field_2._M_local_buf[0] = '\0';
  rule.Generator = false;
  local_290._M_dataplus._M_p = (pointer)paVar3;
  if (responseFlag._M_string_length != 0) {
    std::__cxx11::string::_M_replace((ulong)&rule.RspFile,0,(char *)0x0,0x8bbc9a);
    psVar1 = &cudaCompileMode.field_2._M_allocated_capacity + 1;
    cudaCompileMode._M_dataplus._M_p = (pointer)0x0;
    cudaCompileMode._M_string_length = 1;
    cudaCompileMode.field_2._M_local_buf[8] = 0x20;
    responseFlagVar._M_dataplus._M_p = (pointer)0x1;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    cudaCompileMode.field_2._M_allocated_capacity = (size_type)psVar1;
    responseFlagVar._M_string_length = (size_type)psVar1;
    responseFlagVar.field_2._8_8_ = strlen(local_188.Defines);
    cmdVar.field_2._M_allocated_capacity = (long)&cmdVar.field_2 + 8;
    cmdVar._M_dataplus._M_p = (pointer)0x0;
    cmdVar._M_string_length = 1;
    cmdVar.field_2._M_local_buf[8] = ' ';
    strlen(local_188.Includes);
    cldeps.field_2._M_allocated_capacity = (long)&cldeps.field_2 + 8;
    cldeps._M_dataplus._M_p = (pointer)0x0;
    cldeps._M_string_length = 1;
    cldeps.field_2._M_local_buf[8] = ' ';
    views_16._M_len = 6;
    views_16._M_array = (iterator)&responseFlagVar;
    cmCatViews((string *)&scanCommands,views_16);
    std::__cxx11::string::operator=((string *)&rule.RspContent,(string *)&scanCommands);
    if (scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&scanCommands.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(scanCommands.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((scanCommands.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    responseFlagVar._M_dataplus._M_p = (pointer)responseFlag._M_string_length;
    responseFlagVar._M_string_length = (size_type)responseFlag._M_dataplus._M_p;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = rule.RspFile._M_string_length;
    views_17._M_len = 2;
    views_17._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_17);
    std::__cxx11::string::operator=((string *)&flags,(string *)&cudaCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    local_188.Defines = "";
    local_188.Includes = "";
    iVar15 = std::__cxx11::string::compare((char *)lang);
    if (iVar15 == 0) {
      responseFlagVar._M_dataplus._M_p = (pointer)rule.RspContent._M_string_length;
      responseFlagVar._M_string_length = (size_type)rule.RspContent._M_dataplus._M_p;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      cudaCompileMode._M_dataplus._M_p = (pointer)0x0;
      cudaCompileMode._M_string_length = 1;
      cudaCompileMode.field_2._M_local_buf[8] = 0x20;
      responseFlagVar.field_2._8_8_ = 1;
      cudaCompileMode.field_2._M_allocated_capacity = (size_type)psVar1;
      strlen(local_188.Source);
      views_18._M_len = 3;
      views_18._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cmdVar,views_18);
      std::__cxx11::string::operator=((string *)&rule.RspContent,(string *)&cmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
      local_188.Source = "";
    }
  }
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  cldeps.field_2._M_allocated_capacity = cldeps.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (bVar13) goto LAB_00463cd2;
  responseFlagVar._M_dataplus._M_p = (pointer)0x15;
  responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f45a;
  responseFlagVar.field_2._M_allocated_capacity = 0;
  responseFlagVar.field_2._8_8_ = lang->_M_string_length;
  views_19._M_len = 2;
  views_19._M_array = (iterator)&responseFlagVar;
  cmCatViews(&cudaCompileMode,views_19);
  bVar13 = cmMakefile::IsOn(pcVar6,&cudaCompileMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
    operator_delete(cudaCompileMode._M_dataplus._M_p,
                    cudaCompileMode.field_2._M_allocated_capacity + 1);
  }
  psVar16 = &rule.DepType;
  if (bVar13) {
    bVar13 = cmMakefile::GetIsSourceFileTryCompile(pcVar6);
    if (bVar13) goto LAB_00463cd2;
    std::__cxx11::string::_M_replace
              ((ulong)psVar16,0,(char *)rule.DepType._M_string_length,0x8b9b60);
    std::__cxx11::string::_M_replace
              ((ulong)&rule.DepFile,0,(char *)rule.DepFile._M_string_length,0x8bbcba);
    responseFlagVar._M_dataplus._M_p = (pointer)&responseFlagVar.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&responseFlagVar,"CMAKE_C_COMPILER","");
    cVar19 = cmMakefile::GetDefinition(pcVar6,&responseFlagVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlagVar._M_dataplus._M_p != &responseFlagVar.field_2) {
      operator_delete(responseFlagVar._M_dataplus._M_p,
                      responseFlagVar.field_2._M_allocated_capacity + 1);
    }
    cVar20 = cVar19;
    if (cVar19.Value == (string *)0x0) {
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"CMAKE_CXX_COMPILER","");
      cVar20.Value = cmMakefile::GetSafeDefinition(pcVar6,&local_488);
    }
    ppbVar2 = &scanCommands.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar7 = ((cVar20.Value)->_M_dataplus)._M_p;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&scanCommands,pcVar7,pcVar7 + (cVar20.Value)->_M_string_length);
    if ((cVar19.Value == (string *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2)) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    ppbVar5 = &compileCmds.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    compileCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    compileCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    compileCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar5;
    psVar16 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
    cmsys::SystemTools::GetShortPath(psVar16,(string *)&compileCmds);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    cmMakefile::GetSafeDefinition(pcVar6,&local_2b0);
    responseFlagVar._M_dataplus._M_p =
         (pointer)compileCmds.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    responseFlagVar._M_string_length =
         (size_type)
         compileCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    cudaCompileMode.field_2._M_allocated_capacity = (long)&cudaCompileMode.field_2 + 8;
    cudaCompileMode._M_dataplus._M_p = (pointer)0x0;
    cudaCompileMode._M_string_length = 1;
    cudaCompileMode.field_2._M_local_buf[8] = 0x20;
    responseFlagVar.field_2._8_8_ = 1;
    cmdVar.field_2._M_allocated_capacity = (long)&cmdVar.field_2 + 8;
    cmdVar._M_dataplus._M_p = (pointer)0x0;
    cmdVar._M_string_length = 1;
    cmdVar.field_2._M_local_buf[8] = ' ';
    strlen(local_188.Source);
    views_23._M_len = 10;
    views_23._M_array = (iterator)&responseFlagVar;
    cmCatViews(&local_1c0,views_23);
    std::__cxx11::string::operator=((string *)&cldeps,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar5) {
      operator_delete(compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(compileCmds.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               compileCmds.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    uVar22 = scanCommands.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var23._M_p = (pointer)scanCommands.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)ppbVar2) goto LAB_00463cd2;
  }
  else {
    pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
    responseFlagVar._M_dataplus._M_p = (pointer)0x6;
    responseFlagVar._M_string_length = (long)"The CMAKE_" + 4;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    views_20._M_len = 3;
    views_20._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_20);
    psVar18 = cmMakefile::GetSafeDefinition(pcVar10,&cudaCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    if ((psVar18->_M_string_length == 4) && (*(int *)(psVar18->_M_dataplus)._M_p == 0x6376736d)) {
      std::__cxx11::string::_M_replace
                ((ulong)psVar16,0,(char *)rule.DepType._M_string_length,0x8bac14);
      rule.DepFile._M_string_length = 0;
      *rule.DepFile._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)psVar16,0,(char *)rule.DepType._M_string_length,0x8b9b60);
      std::__cxx11::string::_M_replace
                ((ulong)&rule.DepFile,0,(char *)rule.DepFile._M_string_length,0x8bbcba);
    }
    local_188.DependencyFile = rule.DepFile._M_dataplus._M_p;
    local_188.DependencyTarget = "$out";
    responseFlagVar._M_dataplus._M_p = &DAT_00000014;
    responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f4ec;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    views_21._M_len = 2;
    views_21._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cmdVar,views_21);
    psVar16 = cmMakefile::GetSafeDefinition(pcVar6,&cmdVar);
    ppbVar2 = &scanCommands.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar7 = (psVar16->_M_dataplus)._M_p;
    scanCommands.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&scanCommands,pcVar7,pcVar7 + psVar16->_M_string_length);
    if (scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_620,(cmOutputConverter *)this->LocalGenerator,(string *)&scanCommands,
                 &local_188);
      cudaCompileMode._M_string_length =
           (size_type)(&responseFlagVar.field_2._M_allocated_capacity + 1);
      responseFlagVar._M_dataplus._M_p = (pointer)0x0;
      responseFlagVar._M_string_length = 1;
      responseFlagVar.field_2._M_local_buf[8] = 0x20;
      cudaCompileMode._M_dataplus._M_p = (pointer)0x1;
      cudaCompileMode.field_2._M_allocated_capacity = 0;
      cudaCompileMode.field_2._8_8_ =
           scanCommands.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      views_22._M_len = 2;
      views_22._M_array = (iterator)&cudaCompileMode;
      responseFlagVar.field_2._M_allocated_capacity = cudaCompileMode._M_string_length;
      cmCatViews(&local_488,views_22);
      std::__cxx11::string::_M_append((char *)&flags,(ulong)local_488._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
    }
    if (scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
      operator_delete(scanCommands.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((scanCommands.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    uVar22 = cmdVar.field_2._M_allocated_capacity;
    _Var23._M_p = cmdVar._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdVar._M_dataplus._M_p == &cmdVar.field_2) goto LAB_00463cd2;
  }
  operator_delete(_Var23._M_p,(ulong)((long)&(((pointer)uVar22)->_M_dataplus)._M_p + 1));
LAB_00463cd2:
  if ((withScanning == Yes) && (modmapFormat._M_string_length != 0)) {
    responseFlagVar._M_dataplus._M_p = (pointer)0x6;
    responseFlagVar._M_string_length = (long)"The CMAKE_" + 4;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    responseFlagVar.field_2._8_8_ = lang->_M_string_length;
    views_24._M_len = 3;
    views_24._M_array = (iterator)&responseFlagVar;
    cmCatViews(&cudaCompileMode,views_24);
    psVar16 = cmMakefile::GetRequiredDefinition(pcVar6,&cudaCompileMode);
    pcVar7 = (psVar16->_M_dataplus)._M_p;
    cmdVar._M_dataplus._M_p = (pointer)&cmdVar.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cmdVar,pcVar7,pcVar7 + psVar16->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
      operator_delete(cudaCompileMode._M_dataplus._M_p,
                      cudaCompileMode.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ReplaceString(&cmdVar,"<MODULE_MAP_FILE>","$DYNDEP_MODULE_MAP_FILE");
    cudaCompileMode._M_string_length =
         (size_type)(&responseFlagVar.field_2._M_allocated_capacity + 1);
    responseFlagVar._M_dataplus._M_p = (pointer)0x0;
    responseFlagVar._M_string_length = 1;
    responseFlagVar.field_2._M_local_buf[8] = 0x20;
    cudaCompileMode._M_dataplus._M_p = (pointer)0x1;
    cudaCompileMode.field_2._M_allocated_capacity = 0;
    cudaCompileMode.field_2._8_8_ = cmdVar._M_string_length;
    views_25._M_len = 2;
    views_25._M_array = (iterator)&cudaCompileMode;
    responseFlagVar.field_2._M_allocated_capacity = cudaCompileMode._M_string_length;
    cmCatViews((string *)&scanCommands,views_25);
    std::__cxx11::string::_M_append
              ((char *)&flags,
               (ulong)scanCommands.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (scanCommands.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&scanCommands.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(scanCommands.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((scanCommands.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
      operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
    }
  }
  local_188.Flags = flags._M_dataplus._M_p;
  local_188.DependencyFile = rule.DepFile._M_dataplus._M_p;
  cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
  cudaCompileMode._M_string_length = 0;
  cudaCompileMode.field_2._M_allocated_capacity =
       cudaCompileMode.field_2._M_allocated_capacity & 0xffffffffffffff00;
  iVar15 = std::__cxx11::string::compare((char *)lang);
  if (iVar15 == 0) {
    pcVar9 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    paVar3 = &responseFlagVar.field_2;
    responseFlagVar._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&responseFlagVar,"CUDA_SEPARABLE_COMPILATION","");
    bVar13 = cmGeneratorTarget::GetPropertyAsBool(pcVar9,&responseFlagVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlagVar._M_dataplus._M_p != paVar3) {
      operator_delete(responseFlagVar._M_dataplus._M_p,
                      responseFlagVar.field_2._M_allocated_capacity + 1);
    }
    if (bVar13) {
      pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
      responseFlagVar._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&responseFlagVar,"_CMAKE_CUDA_RDC_FLAG","");
      psVar16 = cmMakefile::GetRequiredDefinition(pcVar10,&responseFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(responseFlagVar._M_dataplus._M_p,
                        responseFlagVar.field_2._M_allocated_capacity + 1);
      }
      responseFlagVar._M_dataplus._M_p = (pointer)cudaCompileMode._M_string_length;
      responseFlagVar._M_string_length = (size_type)cudaCompileMode._M_dataplus._M_p;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = psVar16->_M_string_length;
      views_26._M_len = 3;
      views_26._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cmdVar,views_26);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
    }
    if (WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
        ::compileModes == '\0') {
      WriteCompileRule();
    }
    bVar13 = true;
    lVar26 = 8;
    do {
      uVar22 = *(undefined8 *)((long)&::cmPropertySentinal_abi_cxx11_.field_2 + lVar26 + 8);
      responseFlagVar._M_dataplus._M_p = (pointer)0x5;
      responseFlagVar._M_string_length = (long)"_CMAKE_CUDA_" + 7;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      views_27._M_len = 3;
      views_27._M_array = (iterator)&responseFlagVar;
      responseFlagVar.field_2._8_8_ = uVar22;
      cmCatViews(&cmdVar,views_27);
      responseFlagVar._M_dataplus._M_p = (pointer)0xc;
      responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a8efa7;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      views_28._M_len = 3;
      views_28._M_array = (iterator)&responseFlagVar;
      responseFlagVar.field_2._8_8_ = uVar22;
      cmCatViews((string *)&scanCommands,views_28);
      bVar14 = cmGeneratorTarget::GetPropertyAsBool
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdVar);
      if (bVar14) {
        psVar16 = cmMakefile::GetRequiredDefinition
                            ((this->super_cmCommonTargetGenerator).Makefile,(string *)&scanCommands)
        ;
        responseFlagVar._M_dataplus._M_p = (pointer)cudaCompileMode._M_string_length;
        responseFlagVar._M_string_length = (size_type)cudaCompileMode._M_dataplus._M_p;
        responseFlagVar.field_2._M_allocated_capacity = 0;
        responseFlagVar.field_2._8_8_ = psVar16->_M_string_length;
        views_29._M_len = 2;
        views_29._M_array = (iterator)&responseFlagVar;
        cmCatViews((string *)&compileCmds,views_29);
        std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&compileCmds);
        if (compileCmds.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(compileCmds.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(compileCmds.Values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   compileCmds.Values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
        }
        bVar13 = false;
      }
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(scanCommands.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((scanCommands.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
      bVar27 = lVar26 != 0x38;
      lVar26 = lVar26 + 0x10;
    } while (!bVar14 && bVar27);
    if (bVar13) {
      pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
      responseFlagVar._M_dataplus._M_p = (pointer)&responseFlagVar.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&responseFlagVar,"_CMAKE_CUDA_WHOLE_FLAG","");
      psVar16 = cmMakefile::GetRequiredDefinition(pcVar10,&responseFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlagVar._M_dataplus._M_p != &responseFlagVar.field_2) {
        operator_delete(responseFlagVar._M_dataplus._M_p,
                        responseFlagVar.field_2._M_allocated_capacity + 1);
      }
      responseFlagVar._M_dataplus._M_p = (pointer)cudaCompileMode._M_string_length;
      responseFlagVar._M_string_length = (size_type)cudaCompileMode._M_dataplus._M_p;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = psVar16->_M_string_length;
      views_30._M_len = 2;
      views_30._M_array = (iterator)&responseFlagVar;
      cmCatViews(&cmdVar,views_30);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
        operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
      }
    }
    local_188.CudaCompileMode = cudaCompileMode._M_dataplus._M_p;
  }
  responseFlagVar._M_dataplus._M_p = (pointer)0x6;
  responseFlagVar._M_string_length = (long)"The CMAKE_" + 4;
  responseFlagVar.field_2._M_allocated_capacity = 0;
  responseFlagVar.field_2._8_8_ = lang->_M_string_length;
  views_31._M_len = 3;
  views_31._M_array = (iterator)&responseFlagVar;
  cmCatViews(&cmdVar,views_31);
  psVar16 = cmMakefile::GetRequiredDefinition(pcVar6,&cmdVar);
  cmList::cmList(&compileCmds,psVar16,Yes,No);
  if (compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::replace
              ((ulong)compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,0x8bbd93);
    std::__cxx11::string::replace
              ((ulong)compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,0x8bbda1);
    if (compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::replace
                ((ulong)compileCmds.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,
                 (ulong)cldeps._M_dataplus._M_p);
    }
  }
  pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
  responseFlagVar._M_dataplus._M_p = (pointer)0x6;
  responseFlagVar._M_string_length = (long)"The CMAKE_" + 4;
  responseFlagVar.field_2._M_allocated_capacity = 0;
  responseFlagVar.field_2._8_8_ = lang->_M_string_length;
  views_32._M_len = 3;
  views_32._M_array = (iterator)&responseFlagVar;
  cmCatViews((string *)&scanCommands,views_32);
  psVar16 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&scanCommands);
  if (scanCommands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((scanCommands.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (psVar16->_M_string_length != 0) {
    cmList::Insert(&compileCmds.Values,
                   (const_iterator)
                   compileCmds.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,psVar16,Yes,No);
  }
  pbVar12 = compileCmds.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar21 = compileCmds.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      responseFlagVar._M_dataplus._M_p = (pointer)launcher._M_string_length;
      responseFlagVar._M_string_length = (size_type)launcher._M_dataplus._M_p;
      responseFlagVar.field_2._M_allocated_capacity = 0;
      responseFlagVar.field_2._8_8_ = pbVar21->_M_string_length;
      views_33._M_len = 2;
      views_33._M_array = (iterator)&responseFlagVar;
      cmCatViews((string *)&scanCommands,views_33);
      std::__cxx11::string::operator=((string *)pbVar21,(string *)&scanCommands);
      if (scanCommands.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(scanCommands.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((scanCommands.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_620,(cmOutputConverter *)this->LocalGenerator,pbVar21,&local_188);
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != pbVar12);
  }
  scanCommands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&scanCommands.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  scanCommands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanCommands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)scanCommands.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  cmLocalNinjaGenerator::BuildCommandLine
            (&responseFlagVar,this->LocalGenerator,&compileCmds.Values,config,config,
             (string *)&scanCommands,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&responseFlagVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlagVar._M_dataplus._M_p != &responseFlagVar.field_2) {
    operator_delete(responseFlagVar._M_dataplus._M_p,
                    responseFlagVar.field_2._M_allocated_capacity + 1);
  }
  if (scanCommands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((scanCommands.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  responseFlagVar._M_dataplus._M_p = (pointer)0x13;
  responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a8effb;
  responseFlagVar.field_2._M_allocated_capacity = 0;
  responseFlagVar.field_2._8_8_ = lang->_M_string_length;
  views_34._M_len = 3;
  views_34._M_array = (iterator)&responseFlagVar;
  cmCatViews((string *)&scanCommands,views_34);
  std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&scanCommands);
  if (scanCommands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((scanCommands.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  responseFlagVar._M_dataplus._M_p = &DAT_00000009;
  responseFlagVar._M_string_length = (size_type)anon_var_dwarf_1a7f36e;
  responseFlagVar.field_2._M_allocated_capacity = 0;
  responseFlagVar.field_2._8_8_ = lang->_M_string_length;
  views_35._M_len = 3;
  views_35._M_array = (iterator)&responseFlagVar;
  cmCatViews((string *)&scanCommands,views_35);
  std::__cxx11::string::operator=((string *)&rule.Description,(string *)&scanCommands);
  if (scanCommands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(scanCommands.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((scanCommands.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar17,&rule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds.Values);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmdVar._M_dataplus._M_p != &cmdVar.field_2) {
    operator_delete(cmdVar._M_dataplus._M_p,cmdVar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cudaCompileMode._M_dataplus._M_p != &cudaCompileMode.field_2) {
    operator_delete(cudaCompileMode._M_dataplus._M_p,
                    cudaCompileMode.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
    operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
  }
  cmNinjaRule::~cmNinjaRule(&rule);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeCmd._M_dataplus._M_p != &cmakeCmd.field_2) {
    operator_delete(cmakeCmd._M_dataplus._M_p,cmakeCmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != &val.field_2) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)launcher._M_dataplus._M_p != &launcher.field_2) {
    operator_delete(launcher._M_dataplus._M_p,
                    CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                             launcher.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tdi._M_dataplus._M_p != &tdi.field_2) {
    operator_delete(tdi._M_dataplus._M_p,tdi.field_2._M_allocated_capacity + 1);
  }
  if (local_620 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_620->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)modmapFormat._M_dataplus._M_p != &modmapFormat.field_2) {
    operator_delete(modmapFormat._M_dataplus._M_p,modmapFormat.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)modmapFormatVar._M_dataplus._M_p != &modmapFormatVar.field_2) {
    operator_delete(modmapFormatVar._M_dataplus._M_p,
                    modmapFormatVar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
    operator_delete(responseFlag._M_dataplus._M_p,
                    CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                             responseFlag.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flags._M_dataplus._M_p != &flags.field_2) {
    operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang,
                                              const std::string& config,
                                              WithScanning withScanning)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  vars.CudaCompileMode = "$CUDA_COMPILE_MODE";
  vars.ISPCHeader = "$ISPC_HEADER_FILE";

  cmMakefile* mf = this->GetMakefile();

  // For some cases we scan to dynamically discover dependencies.
  bool const compilationPreprocesses = !this->NeedExplicitPreprocessing(lang);

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_FLAG");
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }
  std::string const modmapFormatVar =
    cmStrCat("CMAKE_", lang, "_MODULE_MAP_FORMAT");
  std::string const modmapFormat =
    this->Makefile->GetSafeDefinition(modmapFormatVar);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(this->GetTargetDependInfoPath(lang, config)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  std::string val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE", config);
  if (cmNonempty(val)) {
    launcher = cmStrCat(val, ' ');
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (withScanning == WithScanning::Yes) {
    const auto& scanDepType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_SCANDEP_DEPFILE_FORMAT"));

    // Rule to scan dependencies of sources that need preprocessing.
    {
      cmList scanCommands;
      std::string scanRuleName;
      std::string ppFileName;
      if (compilationPreprocesses) {
        scanRuleName = this->LanguageScanRule(lang, config);
        ppFileName = "$PREPROCESSED_OUTPUT_FILE";
        std::string const& scanCommand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_SCANDEP_SOURCE"));
        scanCommands.assign(scanCommand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
      } else {
        scanRuleName = this->LanguagePreprocessAndScanRule(lang, config);
        ppFileName = "$out";
        std::string const& ppCommmand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_PREPROCESS_SOURCE"));
        scanCommands.assign(ppCommmand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
        scanCommands.emplace_back(GetScanCommand(
          cmakeCmd, tdi, lang, "$out", "$DYNDEP_INTERMEDIATE_FILE", "$in"));
      }

      auto scanRule = GetScanRule(
        scanRuleName, ppFileName, scanDepType, vars, responseFlag, flags,
        rulePlaceholderExpander.get(), this->GetLocalGenerator(),
        std::move(scanCommands), config);

      scanRule.Comment =
        cmStrCat("Rule for generating ", lang, " dependencies.");
      if (compilationPreprocesses) {
        scanRule.Description =
          cmStrCat("Scanning $in for ", lang, " dependencies");
      } else {
        scanRule.Description =
          cmStrCat("Building ", lang, " preprocessed $out");
      }

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    if (!compilationPreprocesses) {
      // Compilation will not preprocess, so it does not need the defines
      // unless the compiler wants them for some other purpose.
      if (!this->CompileWithDefines(lang)) {
        vars.Defines = "";
      }

      // Rule to scan dependencies of sources that do not need preprocessing.
      std::string const& scanRuleName = this->LanguageScanRule(lang, config);
      std::vector<std::string> scanCommands;
      scanCommands.emplace_back(
        GetScanCommand(cmakeCmd, tdi, lang, "$in", "$out"));

      auto scanRule =
        GetScanRule(scanRuleName, "", scanDepType, vars, "", flags,
                    rulePlaceholderExpander.get(), this->GetLocalGenerator(),
                    std::move(scanCommands), config);

      // Write the rule for generating dependencies for the given language.
      scanRule.Comment = cmStrCat("Rule for generating ", lang,
                                  " dependencies on non-preprocessed files.");
      scanRule.Description =
        cmStrCat("Generating ", lang, " dependencies for $in");

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang, config));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";
    // Ninja's collator writes all outputs using `cmGeneratedFileStream`, so
    // they are only updated if contents actually change. Avoid running
    // dependent jobs if the contents don't change by telling `ninja` to check
    // the timestamp again.
    rule.Restat = "1";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string ddModmapArg;
    if (!modmapFormat.empty()) {
      ddModmapArg += cmStrCat(" --modmapfmt=", modmapFormat);
    }
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmStrCat(
          cmakeCmd, " -E cmake_ninja_dyndep --tdi=", tdi, " --lang=", lang,
          ddModmapArg, " --dd=$out @", rule.RspFile);
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command =
        this->GetLocalGenerator()->BuildCommandLine(ddCmds, config, config);
    }
    rule.Comment =
      cmStrCat("Rule to generate ninja dyndep files for ", lang, '.');
    rule.Description = cmStrCat("Generating ", lang, " dyndep file $out");
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang, config, withScanning));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', vars.Defines, ' ', vars.Includes, ' ', flags);
    flags = cmStrCat(responseFlag, rule.RspFile);
    vars.Defines = "";
    vars.Includes = "";

    // Swift consumes all source files in a module at once, which reaches
    // command line length limits pretty quickly. Inject source files into the
    // response file in this case as well.
    if (lang == "Swift") {
      rule.RspContent = cmStrCat(rule.RspContent, ' ', vars.Source);
      vars.Source = "";
    }
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (!compilationPreprocesses) {
    // The compiler will not do preprocessing, so it has no such dependencies.
  } else if (mf->IsOn(cmStrCat("CMAKE_NINJA_CMCLDEPS_", lang))) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      cmValue d = mf->GetDefinition("CMAKE_C_COMPILER");
      const std::string cl =
        d ? *d : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      std::string cmcldepsPath;
      cmSystemTools::GetShortPath(cmSystemTools::GetCMClDepsCommand(),
                                  cmcldepsPath);
      cldeps = cmStrCat(cmcldepsPath, ' ', lang, ' ', vars.Source,
                        " $DEP_FILE $out \"",
                        mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX"),
                        "\" \"", cl, "\" ");
    }
  } else {
    const auto& depType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_DEPFILE_FORMAT"));
    if (depType == "msvc"_s) {
      rule.DepType = "msvc";
      rule.DepFile.clear();
    } else {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
    }
    vars.DependencyFile = rule.DepFile.c_str();
    vars.DependencyTarget = "$out";

    const std::string flagsName = cmStrCat("CMAKE_DEPFILE_FLAGS_", lang);
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   depfileFlags, vars);
      flags += cmStrCat(' ', depfileFlags);
    }
  }

  if (withScanning == WithScanning::Yes && !modmapFormat.empty()) {
    std::string modmapFlags =
      mf->GetRequiredDefinition(cmStrCat("CMAKE_", lang, "_MODULE_MAP_FLAG"));
    cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                 "$DYNDEP_MODULE_MAP_FILE");
    flags += cmStrCat(' ', modmapFlags);
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  std::string cudaCompileMode;
  if (lang == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    vars.CudaCompileMode = cudaCompileMode.c_str();
  }

  // Rule for compiling object file.
  const std::string cmdVar = cmStrCat("CMAKE_", lang, "_COMPILE_OBJECT");
  const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, "${CODE_CHECK}");
    compileCmds.front().insert(0, "${LAUNCHER}");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  const auto& extraCommands = this->GetMakefile()->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_DEPENDS_EXTRA_COMMANDS"));
  if (!extraCommands.empty()) {
    compileCmds.append(extraCommands);
  }

  for (auto& i : compileCmds) {
    i = cmStrCat(launcher, i);
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds, config, config);

  // Write the rule for compiling file of the given language.
  rule.Comment = cmStrCat("Rule for compiling ", lang, " files.");
  rule.Description = cmStrCat("Building ", lang, " object $out");
  this->GetGlobalGenerator()->AddRule(rule);
}